

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest_FindFileByName_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest_FindFileByName_Test>
             *this)

{
  DescriptorDatabaseTest *this_00;
  
  WithParamInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase*(*)()>::
  parameter_ = &this->parameter_;
  this_00 = (DescriptorDatabaseTest *)operator_new(0x28);
  google::protobuf::anon_unknown_0::DescriptorDatabaseTest::DescriptorDatabaseTest(this_00);
  (this_00->
  super_TestWithParam<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>).
  super_Test._vptr_Test = (_func_int **)&PTR__DescriptorDatabaseTest_015f1818;
  (this_00->
  super_TestWithParam<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>).
  super_WithParamInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__DescriptorDatabaseTest_FindFileByName_Test_015f1858;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }